

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3> *this,
          JsonCodec *codec,Reader input,Type type,Orphanage orphanage)

{
  Client local_68;
  Orphan<capnproto_test::capnp::test::TestInterface> local_50;
  JsonCodec *local_30;
  JsonCodec *codec_local;
  Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3> *this_local;
  Type type_local;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  local_30 = codec;
  codec_local = (JsonCodec *)this;
  type_local.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)__return_storage_ptr__;
  (*(this->super_HandlerBase)._vptr_HandlerBase[4])(&local_68,this,codec);
  Orphanage::newOrphanCopy<capnproto_test::capnp::test::TestInterface::Client>
            (&local_50,&orphanage,&local_68);
  Orphan<capnp::DynamicValue>::Orphan<capnproto_test::capnp::test::TestInterface>
            (__return_storage_ptr__,&local_50);
  Orphan<capnproto_test::capnp::test::TestInterface>::~Orphan(&local_50);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return orphanage.newOrphanCopy(decode(codec, input));
  }